

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LimitSegments.cpp
# Opt level: O0

void __thiscall wasm::LimitSegments::run(LimitSegments *this,Module *module)

{
  bool bVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Index local_1c;
  Module *pMStack_18;
  Index maxDataSegments;
  Module *module_local;
  LimitSegments *this_local;
  
  pMStack_18 = module;
  module_local = (Module *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"limit-segments",&local_41)
  ;
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"limit-segments",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
    Pass::getArgument(&local_78,&this->super_Pass,&local_98,&local_c0);
    uVar2 = std::__cxx11::stoul(&local_78,(size_t *)0x0,10);
    local_1c = (Index)uVar2;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    local_1c = 100000;
  }
  bVar1 = MemoryUtils::ensureLimitedSegments(pMStack_18,local_1c);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to merge segments. ");
    poVar3 = std::operator<<(poVar3,"wasm VMs may not accept this binary");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void run(Module* module) override {
    Index maxDataSegments;
    if (hasArgument("limit-segments")) {
      maxDataSegments = std::stoul(getArgument("limit-segments", ""));
    } else {
      maxDataSegments = WebLimitations::MaxDataSegments;
    }
    if (!MemoryUtils::ensureLimitedSegments(*module, maxDataSegments)) {
      std::cerr << "Unable to merge segments. "
                << "wasm VMs may not accept this binary" << std::endl;
    }
  }